

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

bool __thiscall
Ptex::v2_2::PtexReaderCache::findFile
          (PtexReaderCache *this,char **filename,string *buffer,String *error)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  allocator<char> local_e9;
  String *local_e8;
  string errstr;
  stat statbuf;
  
  bVar4 = true;
  if ((**filename != '/') &&
     ((this->_searchdirs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->_searchdirs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_e8 = error;
    std::__cxx11::string::reserve((ulong)buffer);
    uVar2 = (long)(this->_searchdirs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_searchdirs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar3 = 1;
    do {
      if (uVar2 + lVar3 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errstr,"Can\'t find ptex file: ",&local_e9);
        std::__cxx11::string::append((char *)&errstr);
        std::__cxx11::string::assign((char *)local_e8);
        std::__cxx11::string::~string((string *)&errstr);
        return false;
      }
      std::__cxx11::string::_M_assign((string *)buffer);
      std::__cxx11::string::append((char *)buffer);
      std::__cxx11::string::append((char *)buffer);
      iVar1 = stat((buffer->_M_dataplus)._M_p,(stat *)&statbuf);
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    bVar4 = (ulong)-lVar3 < uVar2;
    *filename = (buffer->_M_dataplus)._M_p;
  }
  return bVar4;
}

Assistant:

bool PtexReaderCache::findFile(const char*& filename, std::string& buffer, Ptex::String& error)
{
    bool isAbsolute = (filename[0] == '/'
#ifdef WINDOWS
                       || filename[0] == '\\'
                       || (isalpha(filename[0]) && filename[1] == ':')
#endif
    );
    if (isAbsolute || _searchdirs.empty()) return true; // no need to search

    // file is relative, search in searchpath
    buffer.reserve(256); // minimize reallocs (will grow automatically)
    struct stat statbuf;
    for (size_t i = 0, size = _searchdirs.size(); i < size; i++) {
        buffer = _searchdirs[i];
        buffer += "/";
        buffer += filename;
        if (stat(buffer.c_str(), &statbuf) == 0) {
            filename = buffer.c_str();
            return true;
        }
    }
    // not found
    std::string errstr = "Can't find ptex file: ";
    errstr += filename;
    error = errstr.c_str();
    return false;
}